

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O0

void __thiscall Fl_Group::draw_children(Fl_Group *this)

{
  Fl_Widget *widget;
  byte bVar1;
  uint uVar2;
  int iVar3;
  Fl_Boxtype FVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int local_2c;
  int i_1;
  Fl_Widget *o;
  Fl_Widget **ppFStack_18;
  int i;
  Fl_Widget **a;
  Fl_Group *this_local;
  
  ppFStack_18 = array(this);
  uVar2 = clip_children(this);
  if (uVar2 != 0) {
    iVar3 = Fl_Widget::x(&this->super_Fl_Widget);
    FVar4 = Fl_Widget::box(&this->super_Fl_Widget);
    iVar5 = Fl::box_dx(FVar4);
    iVar6 = Fl_Widget::y(&this->super_Fl_Widget);
    FVar4 = Fl_Widget::box(&this->super_Fl_Widget);
    iVar7 = Fl::box_dy(FVar4);
    iVar8 = Fl_Widget::w(&this->super_Fl_Widget);
    FVar4 = Fl_Widget::box(&this->super_Fl_Widget);
    iVar9 = Fl::box_dw(FVar4);
    iVar10 = Fl_Widget::h(&this->super_Fl_Widget);
    FVar4 = Fl_Widget::box(&this->super_Fl_Widget);
    iVar11 = Fl::box_dh(FVar4);
    fl_push_clip(iVar3 + iVar5,iVar6 + iVar7,iVar8 - iVar9,iVar10 - iVar11);
  }
  bVar1 = Fl_Widget::damage(&this->super_Fl_Widget);
  if ((bVar1 & 0xfe) == 0) {
    local_2c = this->children_;
    while (local_2c != 0) {
      update_child(this,*ppFStack_18);
      local_2c = local_2c + -1;
      ppFStack_18 = ppFStack_18 + 1;
    }
  }
  else {
    o._4_4_ = this->children_;
    while (o._4_4_ != 0) {
      widget = *ppFStack_18;
      draw_child(this,widget);
      draw_outside_label(this,widget);
      o._4_4_ = o._4_4_ + -1;
      ppFStack_18 = ppFStack_18 + 1;
    }
  }
  uVar2 = clip_children(this);
  if (uVar2 != 0) {
    fl_pop_clip();
  }
  return;
}

Assistant:

void Fl_Group::draw_children() {
  Fl_Widget*const* a = array();

  if (clip_children()) {
    fl_push_clip(x() + Fl::box_dx(box()),
                 y() + Fl::box_dy(box()),
		 w() - Fl::box_dw(box()),
		 h() - Fl::box_dh(box()));
  }

  if (damage() & ~FL_DAMAGE_CHILD) { // redraw the entire thing:
    for (int i=children_; i--;) {
      Fl_Widget& o = **a++;
      draw_child(o);
      draw_outside_label(o);
    }
  } else {	// only redraw the children that need it:
    for (int i=children_; i--;) update_child(**a++);
  }

  if (clip_children()) fl_pop_clip();
}